

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O1

void emtjmp(emtcxdef *ctx,uchar op,uint lbl)

{
  ushort uVar1;
  uint uVar2;
  int16_t tmp;
  short sVar3;
  
  emtres(ctx,1);
  uVar1 = ctx->emtcxofs;
  ctx->emtcxofs = uVar1 + 1;
  ctx->emtcxptr[uVar1] = op;
  if ((ctx->emtcxlbl[lbl].emtlflg & 1) == 0) {
    uVar2 = emtglbl(ctx);
    ctx->emtcxlbl[uVar2].emtllnk = ctx->emtcxlbl[lbl].emtllnk;
    ctx->emtcxlbl[uVar2].emtlofs = ctx->emtcxofs;
    ctx->emtcxlbl[lbl].emtllnk = (ushort)uVar2;
    sVar3 = 0;
  }
  else {
    sVar3 = ctx->emtcxlbl[lbl].emtlofs - ctx->emtcxofs;
  }
  emtres(ctx,2);
  *(short *)(ctx->emtcxptr + ctx->emtcxofs) = sVar3;
  ctx->emtcxofs = ctx->emtcxofs + 2;
  return;
}

Assistant:

void emtjmp(emtcxdef *ctx, uchar op, uint lbl)
{
    emtldef *p = &ctx->emtcxlbl[lbl];
    short    diff;
    uint     fwd;
    
    emtop(ctx, op);
    
    if (p->emtlflg & EMTLFSET)
        diff = p->emtlofs - ctx->emtcxofs;      /* back ref - compute delta */
    else
    {
        diff = 0;
        fwd = emtglbl(ctx);             /* get a forward ref fixup reminder */
        ctx->emtcxlbl[fwd].emtllnk = p->emtllnk;  /* link into label's list */
        ctx->emtcxlbl[fwd].emtlofs = ctx->emtcxofs;       /* remember where */
        p->emtllnk = fwd;          /* make it new head of this label's list */
    }
    emtint2s(ctx, diff);
}